

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wat-writer.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_1::WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr
          (ExprVisitorDelegate *this,SimdShuffleOpExpr *expr)

{
  WatWriter *pWVar1;
  char *s;
  byte *pbVar2;
  int local_34;
  undefined1 auStack_30 [4];
  int32_t lane;
  array<unsigned_char,_16UL> values;
  SimdShuffleOpExpr *expr_local;
  ExprVisitorDelegate *this_local;
  
  pWVar1 = this->writer_;
  values._M_elems._8_8_ = expr;
  s = Opcode::GetName(&expr->opcode);
  WritePutsSpace(pWVar1,s);
  _auStack_30 = Bitcast<std::array<unsigned_char,16ul>,v128&>
                          ((v128 *)(values._M_elems._8_8_ + 0x40));
  for (local_34 = 0; local_34 < 0x10; local_34 = local_34 + 1) {
    pWVar1 = this->writer_;
    pbVar2 = std::array<unsigned_char,_16UL>::operator[]
                       ((array<unsigned_char,_16UL> *)auStack_30,(long)local_34);
    Writef(pWVar1,"%u",(ulong)*pbVar2);
  }
  WriteNewline(this->writer_,false);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result WatWriter::ExprVisitorDelegate::OnSimdShuffleOpExpr(
    SimdShuffleOpExpr* expr) {
  writer_->WritePutsSpace(expr->opcode.GetName());
  std::array<uint8_t, 16> values = Bitcast<std::array<uint8_t, 16>>(expr->val);
  for (int32_t lane = 0; lane < 16; ++lane) {
    writer_->Writef("%u", values[lane]);
  }
  writer_->WriteNewline(NO_FORCE_NEWLINE);
  return Result::Ok;
}